

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_slice.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ArraySliceBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  vector<duckdb::LogicalType,_true> *this_00;
  LogicalTypeId LVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var3;
  undefined4 uVar4;
  size_type sVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  undefined1 auVar10 [8];
  bool bVar11;
  bool end_is_empty_p;
  reference pvVar12;
  pointer pEVar13;
  reference pvVar14;
  LogicalType *other;
  ListSliceBindData *this_01;
  NotImplementedException *this_02;
  BinderException *this_03;
  idx_t i;
  size_type __n;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  LogicalType child_type;
  LogicalType target_type;
  string local_98;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 local_60 [8];
  _Head_base<0UL,_duckdb::Expression_*,_false> local_58;
  _Alloc_hider local_50;
  LogicalType local_48;
  
  pvVar12 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](arguments,0);
  pEVar13 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar12);
  LVar1 = (pEVar13->return_type).id_;
  local_50._M_p = (pointer)this;
  if (LVar1 < LIST) {
    if (1 < LVar1 - 1) {
      if (1 < LVar1 - 0x19) {
LAB_01bdb62c:
        this_03 = (BinderException *)__cxa_allocate_exception(0x10);
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,"ARRAY_SLICE can only operate on LISTs and VARCHARs","");
        BinderException::BinderException(this_03,(string *)&local_98);
        __cxa_throw(this_03,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((long)(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_start == 0x60) {
        this_02 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,
                   "Slice with steps has not been implemented for string types, you can consider rewriting your query as follows:\n SELECT array_to_string((str_split(string, \'\')[begin:end:step], \'\');"
                   ,"");
        NotImplementedException::NotImplementedException(this_02,&local_98);
        __cxa_throw(this_02,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
      this_00 = &(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments;
      pvVar12 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::operator[](arguments,0);
      pEVar13 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(pvVar12);
      bVar11 = LogicalType::IsJSONType(&pEVar13->return_type);
      if (bVar11) {
        LogicalType::LogicalType((LogicalType *)&local_98,VARCHAR);
        pvVar14 = vector<duckdb::LogicalType,_true>::operator[](this_00,0);
        uVar8 = local_98.field_2._M_allocated_capacity;
        sVar5 = local_98._M_string_length;
        pvVar14->id_ = (LogicalTypeId)local_98._M_dataplus._M_p;
        pvVar14->physical_type_ = local_98._M_dataplus._M_p._1_1_;
        uVar15 = *(undefined4 *)
                  &(pvVar14->type_info_).internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        uVar16 = *(undefined4 *)
                  ((long)&(pvVar14->type_info_).internal.
                          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr + 4);
        uVar17 = *(undefined4 *)
                  &(pvVar14->type_info_).internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
        uVar18 = *(undefined4 *)
                  ((long)&(pvVar14->type_info_).internal.
                          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi + 4);
        (pvVar14->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        (pvVar14->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_98._M_string_length = 0;
        local_98.field_2._M_allocated_capacity = 0;
        p_Var2 = (pvVar14->type_info_).internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        (pvVar14->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)sVar5;
        (pvVar14->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          local_78 = uVar15;
          uStack_74 = uVar16;
          uStack_70 = uVar17;
          uStack_6c = uVar18;
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
          uVar15 = local_78;
          uVar16 = uStack_74;
          uVar17 = uStack_70;
          uVar18 = uStack_6c;
        }
        uVar8 = local_98.field_2._M_allocated_capacity;
        bVar11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_98.field_2._M_allocated_capacity !=
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_98._M_string_length._0_4_ = uVar15;
        local_98._M_string_length._4_4_ = uVar16;
        local_98.field_2._M_allocated_capacity._0_4_ = uVar17;
        local_98.field_2._M_allocated_capacity._4_4_ = uVar18;
        if (bVar11) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8);
        }
        LogicalType::~LogicalType((LogicalType *)&local_98);
        LogicalType::LogicalType((LogicalType *)&local_98,VARCHAR);
        uVar9 = local_98.field_2._M_allocated_capacity._4_4_;
        uVar7 = local_98.field_2._M_allocated_capacity._0_4_;
        uVar6 = local_98._M_string_length._4_4_;
        uVar4 = (undefined4)local_98._M_string_length;
        (bound_function->super_BaseScalarFunction).return_type.id_ =
             (LogicalTypeId)local_98._M_dataplus._M_p;
        (bound_function->super_BaseScalarFunction).return_type.physical_type_ =
             local_98._M_dataplus._M_p._1_1_;
        uVar15 = *(undefined4 *)
                  &(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        uVar16 = *(undefined4 *)
                  ((long)&(bound_function->super_BaseScalarFunction).return_type.type_info_.internal
                          .super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr + 4);
        uVar17 = *(undefined4 *)
                  &(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
        uVar18 = *(undefined4 *)
                  ((long)&(bound_function->super_BaseScalarFunction).return_type.type_info_.internal
                          .super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi + 4);
        (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_98._M_string_length = 0;
        local_98.field_2._M_allocated_capacity = 0;
        p_Var2 = (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        *(undefined4 *)
         &(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = uVar4;
        *(undefined4 *)
         ((long)&(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) =
             uVar6;
        *(undefined4 *)
         &(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             uVar7;
        *(undefined4 *)
         ((long)&(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi + 4) = uVar9;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          local_78 = uVar15;
          uStack_74 = uVar16;
          uStack_70 = uVar17;
          uStack_6c = uVar18;
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
          uVar15 = local_78;
          uVar16 = uStack_74;
          uVar17 = uStack_70;
          uVar18 = uStack_6c;
        }
        uVar8 = local_98.field_2._M_allocated_capacity;
        local_98._M_string_length = CONCAT44(uVar16,uVar15);
        local_98.field_2._M_allocated_capacity._4_4_ = uVar18;
        local_98.field_2._M_allocated_capacity._0_4_ = uVar17;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8);
        }
        LogicalType::~LogicalType((LogicalType *)&local_98);
      }
      else {
        pvVar12 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  ::operator[](arguments,0);
        pEVar13 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(pvVar12);
        if (&(bound_function->super_BaseScalarFunction).return_type != &pEVar13->return_type) {
          (bound_function->super_BaseScalarFunction).return_type.id_ = (pEVar13->return_type).id_;
          (bound_function->super_BaseScalarFunction).return_type.physical_type_ =
               (pEVar13->return_type).physical_type_;
          shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                    (&(bound_function->super_BaseScalarFunction).return_type.type_info_,
                     &(pEVar13->return_type).type_info_);
        }
      }
      __n = 1;
      do {
        pvVar12 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  ::operator[](arguments,__n);
        pEVar13 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(pvVar12);
        if ((pEVar13->return_type).id_ != LIST) {
          LogicalType::LogicalType((LogicalType *)&local_98,BIGINT);
          pvVar14 = vector<duckdb::LogicalType,_true>::operator[](this_00,__n);
          uVar8 = local_98.field_2._M_allocated_capacity;
          sVar5 = local_98._M_string_length;
          pvVar14->id_ = (LogicalTypeId)local_98._M_dataplus._M_p;
          pvVar14->physical_type_ = local_98._M_dataplus._M_p._1_1_;
          uVar15 = *(undefined4 *)
                    &(pvVar14->type_info_).internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          uVar16 = *(undefined4 *)
                    ((long)&(pvVar14->type_info_).internal.
                            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 4);
          uVar17 = *(undefined4 *)
                    &(pvVar14->type_info_).internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
          uVar18 = *(undefined4 *)
                    ((long)&(pvVar14->type_info_).internal.
                            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi + 4);
          (pvVar14->type_info_).internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          (pvVar14->type_info_).internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_98._M_string_length = 0;
          local_98.field_2._M_allocated_capacity = 0;
          p_Var2 = (pvVar14->type_info_).internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
          (pvVar14->type_info_).internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)sVar5;
          (pvVar14->type_info_).internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8;
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            local_78 = uVar15;
            uStack_74 = uVar16;
            uStack_70 = uVar17;
            uStack_6c = uVar18;
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
            uVar15 = local_78;
            uVar16 = uStack_74;
            uVar17 = uStack_70;
            uVar18 = uStack_6c;
          }
          uVar8 = local_98.field_2._M_allocated_capacity;
          local_98._M_string_length = CONCAT44(uVar16,uVar15);
          local_98.field_2._M_allocated_capacity._4_4_ = uVar18;
          local_98.field_2._M_allocated_capacity._0_4_ = uVar17;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8 !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8);
          }
          LogicalType::~LogicalType((LogicalType *)&local_98);
        }
        __n = __n + 1;
      } while (__n != 3);
      goto LAB_01bdb47b;
    }
    LogicalType::LogicalType((LogicalType *)&local_98,UNKNOWN);
    pvVar14 = vector<duckdb::LogicalType,_true>::operator[]
                        (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments,
                         0);
    uVar8 = local_98.field_2._M_allocated_capacity;
    sVar5 = local_98._M_string_length;
    pvVar14->id_ = (LogicalTypeId)local_98._M_dataplus._M_p;
    pvVar14->physical_type_ = local_98._M_dataplus._M_p._1_1_;
    uVar15 = *(undefined4 *)
              &(pvVar14->type_info_).internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar16 = *(undefined4 *)
              ((long)&(pvVar14->type_info_).internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
              4);
    uVar17 = *(undefined4 *)
              &(pvVar14->type_info_).internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
    uVar18 = *(undefined4 *)
              ((long)&(pvVar14->type_info_).internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 4);
    (pvVar14->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pvVar14->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_98._M_string_length = 0;
    local_98.field_2._M_allocated_capacity = 0;
    p_Var2 = (pvVar14->type_info_).internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    (pvVar14->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)sVar5;
    (pvVar14->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_78 = uVar15;
      uStack_74 = uVar16;
      uStack_70 = uVar17;
      uStack_6c = uVar18;
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      uVar15 = local_78;
      uVar16 = uStack_74;
      uVar17 = uStack_70;
      uVar18 = uStack_6c;
    }
    uVar8 = local_98.field_2._M_allocated_capacity;
    local_98._M_string_length = CONCAT44(uVar16,uVar15);
    local_98.field_2._M_allocated_capacity._4_4_ = uVar18;
    local_98.field_2._M_allocated_capacity._0_4_ = uVar17;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8);
    }
    LogicalType::~LogicalType((LogicalType *)&local_98);
    LogicalType::LogicalType((LogicalType *)&local_98,SQLNULL);
    uVar8 = local_98.field_2._M_allocated_capacity;
    sVar5 = local_98._M_string_length;
    (bound_function->super_BaseScalarFunction).return_type.id_ =
         (LogicalTypeId)local_98._M_dataplus._M_p;
    (bound_function->super_BaseScalarFunction).return_type.physical_type_ =
         local_98._M_dataplus._M_p._1_1_;
    uVar15 = *(undefined4 *)
              &(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar16 = *(undefined4 *)
              ((long)&(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
              4);
    uVar17 = *(undefined4 *)
              &(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
    uVar18 = *(undefined4 *)
              ((long)&(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 4);
    (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_98._M_string_length = 0;
    local_98.field_2._M_allocated_capacity = 0;
    p_Var2 = (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)sVar5;
    (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_78 = uVar15;
      uStack_74 = uVar16;
      uStack_70 = uVar17;
      uStack_6c = uVar18;
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      uVar15 = local_78;
      uVar16 = uStack_74;
      uVar17 = uStack_70;
      uVar18 = uStack_6c;
    }
    uVar8 = local_98.field_2._M_allocated_capacity;
    local_98._M_string_length = CONCAT44(uVar16,uVar15);
    local_98.field_2._M_allocated_capacity._4_4_ = uVar18;
    local_98.field_2._M_allocated_capacity._0_4_ = uVar17;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8);
    }
  }
  else {
    if (LVar1 == LIST) {
      pvVar12 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::operator[](arguments,0);
      pEVar13 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(pvVar12);
      if (&(bound_function->super_BaseScalarFunction).return_type != &pEVar13->return_type) {
        (bound_function->super_BaseScalarFunction).return_type.id_ = (pEVar13->return_type).id_;
        (bound_function->super_BaseScalarFunction).return_type.physical_type_ =
             (pEVar13->return_type).physical_type_;
        shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                  (&(bound_function->super_BaseScalarFunction).return_type.type_info_,
                   &(pEVar13->return_type).type_info_);
      }
      goto LAB_01bdb47b;
    }
    if (LVar1 != 0x6c) goto LAB_01bdb62c;
    pvVar12 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              ::operator[](arguments,0);
    pEVar13 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(pvVar12);
    other = ArrayType::GetChildType(&pEVar13->return_type);
    LogicalType::LogicalType((LogicalType *)&local_98,other);
    LogicalType::LIST(&local_48,(LogicalType *)&local_98);
    pvVar12 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              ::operator[](arguments,0);
    local_58._M_head_impl =
         (pvVar12->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pvVar12->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    BoundCastExpression::AddCastToType
              ((BoundCastExpression *)local_60,context,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_58,&local_48,false);
    pvVar12 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              ::operator[](arguments,0);
    auVar10 = local_60;
    local_60 = (undefined1  [8])0x0;
    _Var3._M_head_impl =
         (pvVar12->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pvVar12->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)auVar10;
    if (_Var3._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))();
    }
    if (local_60 != (undefined1  [8])0x0) {
      (**(code **)(*(_func_int **)local_60 + 8))();
    }
    local_60 = (undefined1  [8])0x0;
    if (local_58._M_head_impl != (Expression *)0x0) {
      (*((local_58._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_58._M_head_impl = (Expression *)0x0;
    pvVar12 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              ::operator[](arguments,0);
    pEVar13 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(pvVar12);
    if (&(bound_function->super_BaseScalarFunction).return_type != &pEVar13->return_type) {
      (bound_function->super_BaseScalarFunction).return_type.id_ = (pEVar13->return_type).id_;
      (bound_function->super_BaseScalarFunction).return_type.physical_type_ =
           (pEVar13->return_type).physical_type_;
      shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                (&(bound_function->super_BaseScalarFunction).return_type.type_info_,
                 &(pEVar13->return_type).type_info_);
    }
    LogicalType::~LogicalType(&local_48);
  }
  LogicalType::~LogicalType((LogicalType *)&local_98);
LAB_01bdb47b:
  pvVar12 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](arguments,1);
  bVar11 = CheckIfParamIsEmpty(pvVar12);
  if (!bVar11) {
    LogicalType::LogicalType((LogicalType *)&local_98,BIGINT);
    pvVar14 = vector<duckdb::LogicalType,_true>::operator[]
                        (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments,
                         1);
    uVar8 = local_98.field_2._M_allocated_capacity;
    sVar5 = local_98._M_string_length;
    pvVar14->id_ = (LogicalTypeId)local_98._M_dataplus._M_p;
    pvVar14->physical_type_ = local_98._M_dataplus._M_p._1_1_;
    uVar15 = *(undefined4 *)
              &(pvVar14->type_info_).internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar16 = *(undefined4 *)
              ((long)&(pvVar14->type_info_).internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
              4);
    uVar17 = *(undefined4 *)
              &(pvVar14->type_info_).internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
    uVar18 = *(undefined4 *)
              ((long)&(pvVar14->type_info_).internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 4);
    (pvVar14->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pvVar14->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_98._M_string_length = 0;
    local_98.field_2._M_allocated_capacity = 0;
    p_Var2 = (pvVar14->type_info_).internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    (pvVar14->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)sVar5;
    (pvVar14->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_78 = uVar15;
      uStack_74 = uVar16;
      uStack_70 = uVar17;
      uStack_6c = uVar18;
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      uVar15 = local_78;
      uVar16 = uStack_74;
      uVar17 = uStack_70;
      uVar18 = uStack_6c;
    }
    uVar8 = local_98.field_2._M_allocated_capacity;
    local_98._M_string_length = CONCAT44(uVar16,uVar15);
    local_98.field_2._M_allocated_capacity._4_4_ = uVar18;
    local_98.field_2._M_allocated_capacity._0_4_ = uVar17;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8);
    }
    LogicalType::~LogicalType((LogicalType *)&local_98);
  }
  pvVar12 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](arguments,2);
  end_is_empty_p = CheckIfParamIsEmpty(pvVar12);
  if (!end_is_empty_p) {
    LogicalType::LogicalType((LogicalType *)&local_98,BIGINT);
    pvVar14 = vector<duckdb::LogicalType,_true>::operator[]
                        (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments,
                         2);
    uVar8 = local_98.field_2._M_allocated_capacity;
    sVar5 = local_98._M_string_length;
    pvVar14->id_ = (LogicalTypeId)local_98._M_dataplus._M_p;
    pvVar14->physical_type_ = local_98._M_dataplus._M_p._1_1_;
    uVar15 = *(undefined4 *)
              &(pvVar14->type_info_).internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar16 = *(undefined4 *)
              ((long)&(pvVar14->type_info_).internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
              4);
    uVar17 = *(undefined4 *)
              &(pvVar14->type_info_).internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
    uVar18 = *(undefined4 *)
              ((long)&(pvVar14->type_info_).internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 4);
    (pvVar14->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pvVar14->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_98._M_string_length = 0;
    local_98.field_2._M_allocated_capacity = 0;
    p_Var2 = (pvVar14->type_info_).internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    (pvVar14->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)sVar5;
    (pvVar14->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_78 = uVar15;
      uStack_74 = uVar16;
      uStack_70 = uVar17;
      uStack_6c = uVar18;
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      uVar15 = local_78;
      uVar16 = uStack_74;
      uVar17 = uStack_70;
      uVar18 = uStack_6c;
    }
    uVar8 = local_98.field_2._M_allocated_capacity;
    local_98._M_string_length = CONCAT44(uVar16,uVar15);
    local_98.field_2._M_allocated_capacity._4_4_ = uVar18;
    local_98.field_2._M_allocated_capacity._0_4_ = uVar17;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8);
    }
    LogicalType::~LogicalType((LogicalType *)&local_98);
  }
  this_01 = (ListSliceBindData *)operator_new(0x28);
  ListSliceBindData::ListSliceBindData
            (this_01,&(bound_function->super_BaseScalarFunction).return_type,bVar11,end_is_empty_p);
  *(ListSliceBindData **)local_50._M_p = this_01;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
         local_50._M_p;
}

Assistant:

static unique_ptr<FunctionData> ArraySliceBind(ClientContext &context, ScalarFunction &bound_function,
                                               vector<unique_ptr<Expression>> &arguments) {
	D_ASSERT(arguments.size() == 3 || arguments.size() == 4);
	D_ASSERT(bound_function.arguments.size() == 3 || bound_function.arguments.size() == 4);

	switch (arguments[0]->return_type.id()) {
	case LogicalTypeId::ARRAY: {
		// Cast to list
		auto child_type = ArrayType::GetChildType(arguments[0]->return_type);
		auto target_type = LogicalType::LIST(child_type);
		arguments[0] = BoundCastExpression::AddCastToType(context, std::move(arguments[0]), target_type);
		bound_function.return_type = arguments[0]->return_type;
	} break;
	case LogicalTypeId::LIST:
		// The result is the same type
		bound_function.return_type = arguments[0]->return_type;
		break;
	case LogicalTypeId::BLOB:
	case LogicalTypeId::VARCHAR:
		// string slice returns a string
		if (bound_function.arguments.size() == 4) {
			throw NotImplementedException(
			    "Slice with steps has not been implemented for string types, you can consider rewriting your query as "
			    "follows:\n SELECT array_to_string((str_split(string, '')[begin:end:step], '');");
		}
		if (arguments[0]->return_type.IsJSONType()) {
			// This is needed to avoid producing invalid JSON
			bound_function.arguments[0] = LogicalType::VARCHAR;
			bound_function.return_type = LogicalType::VARCHAR;
		} else {
			bound_function.return_type = arguments[0]->return_type;
		}
		for (idx_t i = 1; i < 3; i++) {
			if (arguments[i]->return_type.id() != LogicalTypeId::LIST) {
				bound_function.arguments[i] = LogicalType::BIGINT;
			}
		}
		break;
	case LogicalTypeId::SQLNULL:
	case LogicalTypeId::UNKNOWN:
		bound_function.arguments[0] = LogicalTypeId::UNKNOWN;
		bound_function.return_type = LogicalType::SQLNULL;
		break;
	default:
		throw BinderException("ARRAY_SLICE can only operate on LISTs and VARCHARs");
	}

	bool begin_is_empty = CheckIfParamIsEmpty(arguments[1]);
	if (!begin_is_empty) {
		bound_function.arguments[1] = LogicalType::BIGINT;
	}
	bool end_is_empty = CheckIfParamIsEmpty(arguments[2]);
	if (!end_is_empty) {
		bound_function.arguments[2] = LogicalType::BIGINT;
	}

	return make_uniq<ListSliceBindData>(bound_function.return_type, begin_is_empty, end_is_empty);
}